

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  uint in_EDX;
  uint uVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar2 = (ulong)(uint)unicode_codepoint;
  uVar4 = *(ushort *)((long)&info->userdata + uVar2);
  uVar9 = uVar4 << 8;
  uVar4 = uVar4 >> 8;
  uVar8 = uVar9 | uVar4;
  switch(uVar8) {
  case 0:
    uVar4 = *(ushort *)((long)&info->userdata + uVar2 + 2);
    if ((int)in_EDX < (int)((ushort)(uVar4 << 8 | uVar4 >> 8) - 6)) {
      return (uint)*(byte *)((long)&info->userdata + (long)(int)in_EDX + uVar2 + 6);
    }
    break;
  default:
    if ((uVar9 | uVar4 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                    ,0x60e,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    uVar5 = *(uint *)((long)&info->data + uVar2 + 4);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (0 < (int)uVar5) {
      iVar7 = 0;
      do {
        uVar6 = ((int)(uVar5 - iVar7) >> 1) + iVar7;
        lVar3 = (long)(int)uVar6 * 0xc;
        uVar10 = *(uint *)((long)&info->fontstart + lVar3 + uVar2);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        if (uVar10 <= in_EDX) {
          uVar1 = *(uint *)((long)&info->numGlyphs + lVar3 + uVar2);
          if (in_EDX <= (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18)) {
            uVar5 = *(uint *)((long)&info->loca + lVar3 + uVar2);
            iVar7 = 0;
            if (uVar8 == 0xc) {
              iVar7 = in_EDX - uVar10;
            }
            return iVar7 + (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
          }
          iVar7 = uVar6 + 1;
          uVar6 = uVar5;
        }
        uVar5 = uVar6;
      } while (iVar7 < (int)uVar5);
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                  ,0x5c7,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if ((int)in_EDX < 0x10000) {
      uVar4 = *(ushort *)((long)&info->data + uVar2 + 2);
      uVar9 = uVar4 << 8 | uVar4 >> 8;
      uVar11 = (ulong)(*(byte *)((long)&info->data + uVar2 + 5) & 0xfffffffe) |
               (ulong)*(byte *)((long)&info->data + uVar2 + 4) << 8;
      uVar4 = *(ushort *)((long)&info->userdata + uVar11 + (unicode_codepoint + 0xeU));
      iVar7 = (int)uVar11;
      if ((int)in_EDX < (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
        iVar7 = 0;
      }
      uVar5 = iVar7 + unicode_codepoint + 0xc;
      if (uVar9 != 0) {
        uVar4 = *(ushort *)((long)&info->data + uVar2);
        uVar10 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        do {
          uVar10 = uVar10 >> 1;
          uVar6 = uVar10 & 0xfffffffe;
          uVar4 = *(ushort *)((long)&info->userdata + (ulong)uVar6 + (ulong)uVar5);
          if ((int)in_EDX <= (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
            uVar6 = 0;
          }
          uVar5 = uVar6 + uVar5;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar11 = (ulong)((uVar5 - unicode_codepoint) + 0x1fff4 & 0x1fffe);
      uVar4 = *(ushort *)((long)&info->userdata + uVar11 + (unicode_codepoint + 0xeU));
      if ((int)in_EDX <= (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
        uVar4 = *(ushort *)((long)&info->userdata + uVar2 + 6);
        uVar9 = uVar4 << 8 | uVar4 >> 8;
        uVar4 = *(ushort *)((long)&info->fontstart + uVar11 + (uVar9 & 0xfffffffe) + uVar2);
        uVar5 = 0;
        uVar10 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        if ((int)uVar10 <= (int)in_EDX) {
          uVar9 = uVar9 >> 1;
          lVar3 = (ulong)((uint)uVar9 + (uint)uVar9) * 3;
          uVar4 = *(ushort *)((long)&info->fontstart + uVar11 + lVar3 + uVar2 + 0xe + -0xe);
          uVar4 = uVar4 << 8 | uVar4 >> 8;
          if (uVar4 == 0) {
            uVar4 = *(ushort *)
                     ((long)&info->fontstart + uVar11 + (ulong)uVar9 * 4 + uVar2 + 0xe + -0xe);
            uVar5 = (ushort)(uVar4 << 8 | uVar4 >> 8) + in_EDX;
          }
          else {
            uVar4 = *(ushort *)
                     ((long)&info->fontstart +
                     uVar11 + (long)(int)((in_EDX - uVar10) * 2) + lVar3 + uVar2 + uVar4);
            uVar5 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
          }
        }
        return uVar5 & 0xffff;
      }
      __assert_fail("unicode_codepoint <= ttUSHORT(data + endCount + 2*item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_truetype.h"
                    ,0x5eb,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    break;
  case 6:
    uVar4 = *(ushort *)((long)&info->userdata + uVar2 + 6);
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    if (in_EDX < uVar4) {
      return 0;
    }
    uVar9 = *(ushort *)((long)&info->data + uVar2);
    if ((uint)(ushort)(uVar9 << 8 | uVar9 >> 8) + (uint)uVar4 <= in_EDX) {
      return 0;
    }
    uVar4 = *(ushort *)((long)&info->data + (in_EDX - uVar4) * 2 + uVar2 + 2);
    return (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}